

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void hydro_memzero(void *pnt,size_t len)

{
  size_t i;
  uchar *pnt_;
  size_t len_local;
  void *pnt_local;
  
  i = 0;
  while (i < len) {
    *(undefined1 *)((long)pnt + i) = 0;
    i = i + 1;
  }
  return;
}

Assistant:

void
hydro_memzero(void *pnt, size_t len)
{
#ifdef HAVE_EXPLICIT_BZERO
    explicit_bzero(pnt, len);
#else
    volatile unsigned char *volatile pnt_ = (volatile unsigned char *volatile) pnt;
    size_t i                              = (size_t) 0U;

    while (i < len) {
        pnt_[i++] = 0U;
    }
#endif
}